

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_connect_deferred(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen,_Bool *done)

{
  int iVar1;
  void *pvVar2;
  _Bool _Var3;
  CURLcode CVar4;
  size_t sVar5;
  curltime timestamp;
  CURLcode result;
  ssl_connect_data *connssl;
  _Bool *done_local;
  size_t blen_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar2 = cf->ctx;
  *done = false;
  if (*(int *)((long)pvVar2 + 0xc0) == 1) {
    CVar4 = ssl_cf_set_earlydata(cf,data,buf,blen);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    *(undefined4 *)((long)pvVar2 + 0xc0) = 2;
    sVar5 = Curl_bufq_len((bufq *)((long)pvVar2 + 0x68));
    *(size_t *)((long)pvVar2 + 0xb0) = sVar5;
  }
  CVar4 = ssl_cf_connect(cf,data,done);
  if ((CVar4 == CURLE_OK) && ((*done & 1U) != 0)) {
    timestamp._12_4_ = 0;
    timestamp._0_12_ = *(undefined1 (*) [12])((long)pvVar2 + 0x50);
    Curl_pgrsTimeWas(data,TIMER_APPCONNECT,timestamp);
    iVar1 = *(int *)((long)pvVar2 + 0xc0);
    if (iVar1 != 0) {
      if (iVar1 == 4) {
        _Var3 = Curl_ssl_cf_is_proxy(cf);
        if (!_Var3) {
          Curl_pgrsEarlyData(data,*(curl_off_t *)((long)pvVar2 + 0xb0));
        }
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"Server accepted %zu bytes of TLS early data.",
                     *(undefined8 *)((long)pvVar2 + 0xb0));
        }
      }
      else if (iVar1 == 5) {
        _Var3 = Curl_ssl_cf_is_proxy(cf);
        if (!_Var3) {
          Curl_pgrsEarlyData(data,-*(long *)((long)pvVar2 + 0xb0));
        }
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"Server rejected TLS early data.");
        }
        *(undefined8 *)((long)pvVar2 + 0xb0) = 0;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ssl_cf_connect_deferred(struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        const void *buf, size_t blen,
                                        bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(connssl->state == ssl_connection_deferred);
  *done = FALSE;
  if(connssl->earlydata_state == ssl_earlydata_await) {
    result = ssl_cf_set_earlydata(cf, data, buf, blen);
    if(result)
      return result;
    /* we buffered any early data we'd like to send. Actually
     * do the connect now which sends it and performs the handshake. */
    connssl->earlydata_state = ssl_earlydata_sending;
    connssl->earlydata_skip = Curl_bufq_len(&connssl->earlydata);
  }

  result = ssl_cf_connect(cf, data, done);

  if(!result && *done) {
    Curl_pgrsTimeWas(data, TIMER_APPCONNECT, connssl->handshake_done);
    switch(connssl->earlydata_state) {
    case ssl_earlydata_none:
      break;
    case ssl_earlydata_accepted:
      if(!Curl_ssl_cf_is_proxy(cf))
        Curl_pgrsEarlyData(data, (curl_off_t)connssl->earlydata_skip);
      infof(data, "Server accepted %zu bytes of TLS early data.",
            connssl->earlydata_skip);
      break;
    case ssl_earlydata_rejected:
      if(!Curl_ssl_cf_is_proxy(cf))
        Curl_pgrsEarlyData(data, -(curl_off_t)connssl->earlydata_skip);
      infof(data, "Server rejected TLS early data.");
      connssl->earlydata_skip = 0;
      break;
    default:
      /* This should not happen. Either we do not use early data or we
       * should know if it was accepted or not. */
      DEBUGASSERT(NULL);
      break;
    }
  }
  return result;
}